

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

hwaddr ppc_hash32_bat_lookup(PowerPCCPU_conflict3 *cpu,target_ulong ea,int rwx,int *prot)

{
  ulong batu_00;
  ulong batl_00;
  target_ulong (*patVar1) [8];
  int iVar2;
  hwaddr raddr;
  target_ulong mask;
  target_ulong batl;
  target_ulong batu;
  target_ulong (*patStack_48) [8];
  int i;
  target_ulong *BATut;
  target_ulong *BATlt;
  CPUPPCState_conflict2 *env;
  int *prot_local;
  int rwx_local;
  target_ulong ea_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  if (rwx == 2) {
    patVar1 = (cpu->env).IBAT;
    patStack_48 = (cpu->env).IBAT;
  }
  else {
    patVar1 = (cpu->env).DBAT;
    patStack_48 = (cpu->env).DBAT;
  }
  BATut = patVar1[1];
  batu._4_4_ = 0;
  while( true ) {
    if ((cpu->env).nb_BATs <= batu._4_4_) {
      return 0xffffffffffffffff;
    }
    batu_00 = (*patStack_48)[(int)batu._4_4_];
    batl_00 = BATut[(int)batu._4_4_];
    if ((cpu->env).mmu_model == POWERPC_MMU_601) {
      raddr = hash32_bat_601_size(cpu,batu_00,batl_00);
    }
    else {
      raddr = hash32_bat_size(cpu,batu_00,batl_00);
    }
    if ((raddr != 0) && ((ea & raddr) == (batu_00 & 0xfffe0000))) break;
    batu._4_4_ = batu._4_4_ + 1;
  }
  if ((cpu->env).mmu_model == POWERPC_MMU_601) {
    iVar2 = hash32_bat_601_prot(cpu,batu_00,batl_00);
    *prot = iVar2;
  }
  else {
    iVar2 = hash32_bat_prot(cpu,batu_00,batl_00);
    *prot = iVar2;
  }
  return (batl_00 & raddr | ea & (raddr ^ 0xffffffffffffffff)) & 0xfffffffffffff000;
}

Assistant:

static hwaddr ppc_hash32_bat_lookup(PowerPCCPU *cpu, target_ulong ea, int rwx,
                                    int *prot)
{
    CPUPPCState *env = &cpu->env;
    target_ulong *BATlt, *BATut;
    int i;

    LOG_BATS("%s: %cBAT v " TARGET_FMT_lx "\n", __func__,
             rwx == 2 ? 'I' : 'D', ea);
    if (rwx == 2) {
        BATlt = env->IBAT[1];
        BATut = env->IBAT[0];
    } else {
        BATlt = env->DBAT[1];
        BATut = env->DBAT[0];
    }
    for (i = 0; i < env->nb_BATs; i++) {
        target_ulong batu = BATut[i];
        target_ulong batl = BATlt[i];
        target_ulong mask;

        if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
            mask = hash32_bat_601_size(cpu, batu, batl);
        } else {
            mask = hash32_bat_size(cpu, batu, batl);
        }
        LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                 " BATl " TARGET_FMT_lx "\n", __func__,
                 type == ACCESS_CODE ? 'I' : 'D', i, ea, batu, batl);

        if (mask && ((ea & mask) == (batu & BATU32_BEPI))) {
            hwaddr raddr = (batl & mask) | (ea & ~mask);

            if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
                *prot = hash32_bat_601_prot(cpu, batu, batl);
            } else {
                *prot = hash32_bat_prot(cpu, batu, batl);
            }

            return raddr & TARGET_PAGE_MASK;
        }
    }

    /* No hit */
#if defined(DEBUG_BATS)
    if (qemu_log_enabled()) {
        LOG_BATS("no BAT match for " TARGET_FMT_lx ":\n", ea);
        for (i = 0; i < 4; i++) {
            BATu = &BATut[i];
            BATl = &BATlt[i];
            BEPIu = *BATu & BATU32_BEPIU;
            BEPIl = *BATu & BATU32_BEPIL;
            bl = (*BATu & 0x00001FFC) << 15;
            LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                     " BATl " TARGET_FMT_lx "\n\t" TARGET_FMT_lx " "
                     TARGET_FMT_lx " " TARGET_FMT_lx "\n",
                     __func__, type == ACCESS_CODE ? 'I' : 'D', i, ea,
                     *BATu, *BATl, BEPIu, BEPIl, bl);
        }
    }
#endif

    return -1;
}